

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O2

void __thiscall duckdb::ColumnDataCheckpointer::FinalizeCheckpoint(ColumnDataCheckpointer *this)

{
  vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *this_00;
  ColumnCheckpointState *state;
  ColumnData *this_01;
  pointer pSVar1;
  reference pvVar2;
  pointer pSVar3;
  ColumnDataCheckpointer *this_02;
  ulong __n;
  reference rVar4;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> new_segments;
  SegmentLock l;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> local_78;
  ColumnDataCheckpointer *local_70;
  ColumnDataCheckpointer *local_68;
  ulong local_60;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  local_58;
  unique_lock<std::mutex> local_40;
  
  local_70 = (ColumnDataCheckpointer *)&this->has_changes;
  __n = 0;
  local_68 = this;
  while (this_00 = local_68->checkpoint_states,
        __n < (ulong)((long)(this_00->
                            super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                            ).
                            super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->
                            super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                            ).
                            super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    pvVar2 = vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true>::get<true>
                       (this_00,__n);
    state = pvVar2->_M_data;
    this_01 = state->column_data;
    this_02 = local_70;
    rVar4 = vector<bool,_true>::get<true>((vector<bool,_true> *)local_70,__n);
    local_60 = __n;
    if ((*rVar4._M_p & rVar4._M_mask) == 0) {
      WritePersistentSegments(this_02,state);
    }
    else {
      SegmentTree<duckdb::ColumnSegment,_false>::MoveSegments
                ((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *)&local_58,
                 &(this_01->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
      ::std::
      vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ::~vector(&local_58);
    }
    LOCK();
    (this_01->compression).ptr._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    SegmentTree<duckdb::ColumnSegment,_false>::MoveSegments
              ((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *)&local_58,
               &(state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>);
    ::std::unique_lock<std::mutex>::unique_lock
              (&local_40,&(this_01->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock)
    ;
    pSVar1 = local_58.
             super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar3 = local_58.
                  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1)
    {
      local_78._M_t.
      super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
      super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true,_true>
            )(pSVar3->node).
             super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
             .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
      (pSVar3->node).
      super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
      super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
      super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
      ColumnData::AppendSegment
                (this_01,(SegmentLock *)&local_40,
                 (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  *)&local_78);
      ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::
      ~unique_ptr(&local_78);
    }
    ColumnData::ClearUpdates(this_01);
    ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
    ::std::
    vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
    ::~vector(&local_58);
    __n = local_60 + 1;
  }
  return;
}

Assistant:

void ColumnDataCheckpointer::FinalizeCheckpoint() {
	for (idx_t i = 0; i < checkpoint_states.size(); i++) {
		auto &state = checkpoint_states[i].get();
		auto &col_data = state.column_data;
		if (has_changes[i]) {
			// Move the existing segments out of the column data
			// they will be destructed at the end of the scope
			auto to_delete = col_data.data.MoveSegments();
		} else {
			WritePersistentSegments(state);
		}

		// reset the compression function
		col_data.compression.reset();
		// replace the old tree with the new one
		auto new_segments = state.new_tree.MoveSegments();
		auto l = col_data.data.Lock();
		for (auto &new_segment : new_segments) {
			col_data.AppendSegment(l, std::move(new_segment.node));
		}
		col_data.ClearUpdates();
	}
}